

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ImmediateAssertionStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ImmediateAssertionStatement,slang::ast::AssertionKind&,slang::ast::Expression_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,bool&,bool&,slang::SourceRange>
          (BumpAllocator *this,AssertionKind *args,Expression *args_1,Statement **args_2,
          Statement **args_3,bool *args_4,bool *args_5,SourceRange *args_6)

{
  SourceRange sourceRange;
  ImmediateAssertionStatement *pIVar1;
  ImmediateAssertionStatement *in_RCX;
  SourceLocation in_RDI;
  undefined8 in_R8;
  AssertionKind assertionKind;
  Expression *in_R9;
  SourceLocation unaff_retaddr;
  undefined8 *in_stack_00000010;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  assertionKind = (AssertionKind)((ulong)in_R8 >> 0x20);
  pIVar1 = (ImmediateAssertionStatement *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sourceRange.endLoc = unaff_retaddr;
  sourceRange.startLoc = in_RDI;
  ast::ImmediateAssertionStatement::ImmediateAssertionStatement
            (in_RCX,assertionKind,in_R9,(Statement *)in_stack_00000010[1],
             (Statement *)*in_stack_00000010,SUB81((ulong)pIVar1 >> 0x38,0),
             SUB81((ulong)pIVar1 >> 0x30,0),sourceRange);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }